

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall HighFreqPub::~HighFreqPub(HighFreqPub *this)

{
  if (this->hfPub != (zsock_t *)0x0) {
    zsock_destroy_checked
              (&this->hfPub,
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
               ,0x13);
    this->hfPub = (zsock_t *)0x0;
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

HighFreqPub::~HighFreqPub() {
    if (hfPub != NULL) {
        zsock_destroy(&hfPub);
        hfPub = NULL;
    }
}